

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O0

vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
* __thiscall
vkt::tessellation::anon_unknown_0::PrimitiveSetInvariance::InvariantInnerTriangleSetTestInstance::
genTessLevelCases(vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                  *__return_storage_ptr__,InvariantInnerTriangleSetTestInstance *this)

{
  size_type sVar1;
  const_reference this_00;
  const_reference pvVar2;
  float fVar3;
  int local_b0;
  int local_ac;
  int i;
  int subNdx;
  LevelCase levelCase;
  TessLevels levels;
  TessLevels *base;
  int baseNdx;
  undefined1 local_4c [8];
  Random rnd;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  baseResults;
  int numSubCases;
  InvariantInnerTriangleSetTestInstance *this_local;
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  *result;
  
  InvarianceTestInstance::genTessLevelCases
            ((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
              *)&rnd.m_rnd.w,&this->super_InvarianceTestInstance);
  rnd.m_rnd.z._3_1_ = 0;
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::vector(__return_storage_ptr__);
  de::Random::Random((Random *)local_4c,0x7b);
  base._0_4_ = 0;
  while( true ) {
    sVar1 = std::
            vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
            ::size((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                    *)&rnd.m_rnd.w);
    if ((int)sVar1 <= (int)base) break;
    this_00 = std::
              vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
              ::operator[]((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
                            *)&rnd.m_rnd.w,(long)(int)base);
    pvVar2 = std::
             vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
             operator[](&this_00->levels,0);
    levels.outer._0_8_ = *(undefined8 *)(pvVar2->outer + 2);
    levelCase.mem = (int)pvVar2->inner[0];
    levelCase._28_4_ = pvVar2->inner[1];
    levels.inner = *(float (*) [2])pvVar2->outer;
    LevelCase::LevelCase((LevelCase *)&i);
    for (local_ac = 0; local_ac < 4; local_ac = local_ac + 1) {
      std::vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>::
      push_back((vector<vkt::tessellation::TessLevels,_std::allocator<vkt::tessellation::TessLevels>_>
                 *)&i,(value_type *)&levelCase.mem);
      for (local_b0 = 0; local_b0 < 4; local_b0 = local_b0 + 1) {
        fVar3 = de::Random::getFloat((Random *)local_4c,2.0,16.0);
        levels.inner[local_b0] = fVar3;
      }
      if ((this->super_InvarianceTestInstance).m_caseDef.primitiveType ==
          TESSPRIMITIVETYPE_TRIANGLES) {
        fVar3 = de::Random::getFloat((Random *)local_4c,2.0,16.0);
        levelCase._28_4_ = fVar3;
      }
    }
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::push_back(__return_storage_ptr__,(value_type *)&i);
    LevelCase::~LevelCase((LevelCase *)&i);
    base._0_4_ = (int)base + 1;
  }
  rnd.m_rnd.z._3_1_ = 1;
  de::Random::~Random((Random *)local_4c);
  if ((rnd.m_rnd.z._3_1_ & 1) == 0) {
    std::
    vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
    ::~vector(__return_storage_ptr__);
  }
  std::
  vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
  ::~vector((vector<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase,_std::allocator<vkt::tessellation::(anonymous_namespace)::PrimitiveSetInvariance::LevelCase>_>
             *)&rnd.m_rnd.w);
  return __return_storage_ptr__;
}

Assistant:

std::vector<LevelCase> genTessLevelCases (void) const
	{
		const int						numSubCases		= 4;
		const std::vector<LevelCase>	baseResults		= InvarianceTestInstance::genTessLevelCases();
		std::vector<LevelCase>			result;
		de::Random						rnd				(123);

		// Generate variants with different values for irrelevant levels.
		for (int baseNdx = 0; baseNdx < static_cast<int>(baseResults.size()); ++baseNdx)
		{
			const TessLevels&	base	= baseResults[baseNdx].levels[0];
			TessLevels			levels	= base;
			LevelCase			levelCase;

			for (int subNdx = 0; subNdx < numSubCases; ++subNdx)
			{
				levelCase.levels.push_back(levels);

				for (int i = 0; i < DE_LENGTH_OF_ARRAY(levels.outer); ++i)
					levels.outer[i] = rnd.getFloat(2.0f, 16.0f);
				if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
					levels.inner[1] = rnd.getFloat(2.0f, 16.0f);
			}

			result.push_back(levelCase);
		}

		return result;
	}